

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkqsort.c
# Opt level: O2

void mkqsort(uchar **a,int n,int depth)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  uchar **ppuVar6;
  uchar **ppuVar7;
  uchar **ppuVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uchar **c;
  long lVar14;
  uchar **a_00;
  ulong uVar15;
  uchar **ppuVar16;
  
  uVar10 = (ulong)(uint)n;
LAB_001d3c53:
  uVar11 = (uint)uVar10;
  if ((int)uVar11 < 0x14) {
    inssort(a,uVar11,depth);
    return;
  }
  ppuVar7 = a + (uVar10 >> 1 & 0x7fffffff);
  uVar5 = uVar10 & 0xffffffff;
  c = a + (uVar5 - 1);
  ppuVar8 = c;
  ppuVar6 = a;
  if (0x1e < uVar11) {
    uVar15 = (ulong)(uVar11 & 0xfffffff8);
    uVar10 = (ulong)(uVar11 >> 2 & 0xfffffffe);
    ppuVar6 = med3func(a,(uchar **)(uVar15 + (long)a),a + uVar10,depth);
    ppuVar7 = med3func((uchar **)((long)ppuVar7 - uVar15),ppuVar7,(uchar **)((long)ppuVar7 + uVar15)
                       ,depth);
    ppuVar8 = med3func(c + -uVar10,(uchar **)((long)c - uVar15),c,depth);
  }
  ppuVar8 = med3func(ppuVar6,ppuVar7,ppuVar8,depth);
  puVar3 = *a;
  *a = *ppuVar8;
  *ppuVar8 = puVar3;
  bVar1 = (*a)[depth];
  ppuVar8 = a + 1;
  ppuVar6 = ppuVar8;
  ppuVar7 = c;
LAB_001d3d41:
  lVar13 = (long)ppuVar8 << 0x1d;
  for (a_00 = ppuVar8; ppuVar16 = ppuVar7, a_00 <= ppuVar7; a_00 = a_00 + 1) {
    bVar2 = (*a_00)[depth];
    if (bVar1 < bVar2) break;
    if (bVar2 == bVar1) {
      puVar3 = *ppuVar6;
      *ppuVar6 = *a_00;
      *a_00 = puVar3;
      ppuVar6 = ppuVar6 + 1;
    }
    lVar13 = lVar13 + 0x100000000;
    ppuVar8 = ppuVar8 + 1;
  }
  do {
    if (ppuVar16 < a_00) {
      lVar9 = (long)ppuVar6 - (long)a >> 3;
      lVar14 = (long)ppuVar8 - (long)ppuVar6 >> 3;
      if (lVar14 <= lVar9) {
        lVar9 = lVar14;
      }
      vecswap2(a,a_00 + -(long)(int)lVar9,(int)lVar9);
      uVar10 = (long)c - (long)ppuVar7 >> 3;
      lVar9 = (long)((long)a + (uVar5 * 8 - (long)c)) >> 3;
      uVar12 = (uint)uVar10;
      uVar11 = (int)lVar9 - 1;
      if ((long)uVar10 < lVar9) {
        uVar11 = uVar12;
      }
      vecswap2(a_00,a + (uVar5 - (long)(int)uVar11),uVar11);
      if (1 < (int)lVar14) {
        mkqsort(a,(int)lVar14,depth);
      }
      lVar13 = lVar13 + (long)ppuVar6 * -0x20000000 >> 0x20;
      if (a[lVar13][depth] != '\0') {
        mkqsort(a + lVar13,
                (int)((long)a + ((((long)ppuVar6 - (long)a) + uVar5 * 8) - (long)c) >> 3) + -1,
                depth + 1);
      }
      if ((int)uVar12 < 2) {
        return;
      }
      a = a + (uVar5 - (uVar12 & 0x7fffffff));
      goto LAB_001d3c53;
    }
    puVar3 = *ppuVar16;
    if (puVar3[depth] < bVar1) break;
    if (puVar3[depth] == bVar1) {
      *ppuVar16 = *c;
      *c = puVar3;
      c = c + -1;
    }
    ppuVar7 = ppuVar7 + -1;
    ppuVar16 = ppuVar16 + -1;
  } while( true );
  puVar4 = *a_00;
  *a_00 = puVar3;
  *ppuVar16 = puVar4;
  ppuVar8 = a_00 + 1;
  ppuVar7 = ppuVar16 + -1;
  goto LAB_001d3d41;
}

Assistant:

void mkqsort(unsigned char **a, int n, int depth)
{   int d, r, partval;
    unsigned char **pa, **pb, **pc, **pd, **pl, **pm, **pn, *t;
    if (n < 20) {
        inssort(a, n, depth);
        return;
    }
    pl = a;
    pm = a + (n/2);
    pn = a + (n-1);
    if (n > 30) { /* On big arrays, pseudomedian of 9 */
        d = (n/8);
        pl = med3(pl, pl+d, pl+2*d);
        pm = med3(pm-d, pm, pm+d);
        pn = med3(pn-2*d, pn-d, pn);
    }
    pm = med3(pl, pm, pn);
    swap2(a, pm);
    partval = ptr2char(a);
    pa = pb = a + 1;
    pc = pd = a + n-1;
    for (;;) {
        while (pb <= pc && (r = ptr2char(pb)-partval) <= 0) {
            if (r == 0) { swap2(pa, pb); pa++; }
            pb++;
        }
        while (pb <= pc && (r = ptr2char(pc)-partval) >= 0) {
            if (r == 0) { swap2(pc, pd); pd--; }
            pc--;
       }
        if (pb > pc) break;
        swap2(pb, pc);
        pb++;
        pc--;
    }
    pn = a + n;
    r = min(pa-a, pb-pa);    vecswap2(a,  pb-r, r);
    r = min(pd-pc, pn-pd-1); vecswap2(pb, pn-r, r);
    if ((r = pb-pa) > 1)
        mkqsort(a, r, depth);
    if (ptr2char(a + r) != 0)
        mkqsort(a + r, pa-a + pn-pd-1, depth+1);
    if ((r = pd-pc) > 1)
        mkqsort(a + n-r, r, depth);
}